

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O3

int mbedtls_hmac_drbg_self_test(int verbose)

{
  int iVar1;
  mbedtls_md_info_t *md_info;
  long lVar2;
  mbedtls_hmac_drbg_context *ctx_1;
  mbedtls_hmac_drbg_context ctx;
  uchar buf [80];
  mbedtls_hmac_drbg_context local_e8;
  uchar local_68 [80];
  
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  local_e8.md_ctx.md_info = (mbedtls_md_info_t *)0x0;
  local_e8.md_ctx.md_ctx = (void *)0x0;
  local_e8.md_ctx.hmac_ctx = (void *)0x0;
  local_e8.V[0] = '\0';
  local_e8.V[1] = '\0';
  local_e8.V[2] = '\0';
  local_e8.V[3] = '\0';
  local_e8.V[4] = '\0';
  local_e8.V[5] = '\0';
  local_e8.V[6] = '\0';
  local_e8.V[7] = '\0';
  local_e8.V[8] = '\0';
  local_e8.V[9] = '\0';
  local_e8.V[10] = '\0';
  local_e8.V[0xb] = '\0';
  local_e8.V[0xc] = '\0';
  local_e8.V[0xd] = '\0';
  local_e8.V[0xe] = '\0';
  local_e8.V[0xf] = '\0';
  local_e8.V[0x10] = '\0';
  local_e8.V[0x11] = '\0';
  local_e8.V[0x12] = '\0';
  local_e8.V[0x13] = '\0';
  local_e8.V[0x14] = '\0';
  local_e8.V[0x15] = '\0';
  local_e8.V[0x16] = '\0';
  local_e8.V[0x17] = '\0';
  local_e8.V[0x18] = '\0';
  local_e8.V[0x19] = '\0';
  local_e8.V[0x1a] = '\0';
  local_e8.V[0x1b] = '\0';
  local_e8.V[0x1c] = '\0';
  local_e8.V[0x1d] = '\0';
  local_e8.V[0x1e] = '\0';
  local_e8.V[0x1f] = '\0';
  local_e8.V[0x20] = '\0';
  local_e8.V[0x21] = '\0';
  local_e8.V[0x22] = '\0';
  local_e8.V[0x23] = '\0';
  local_e8.V[0x24] = '\0';
  local_e8.V[0x25] = '\0';
  local_e8.V[0x26] = '\0';
  local_e8.V[0x27] = '\0';
  local_e8.V[0x28] = '\0';
  local_e8.V[0x29] = '\0';
  local_e8.V[0x2a] = '\0';
  local_e8.V[0x2b] = '\0';
  local_e8.V[0x2c] = '\0';
  local_e8.V[0x2d] = '\0';
  local_e8.V[0x2e] = '\0';
  local_e8.V[0x2f] = '\0';
  local_e8.V[0x30] = '\0';
  local_e8.V[0x31] = '\0';
  local_e8.V[0x32] = '\0';
  local_e8.V[0x33] = '\0';
  local_e8.V[0x34] = '\0';
  local_e8.V[0x35] = '\0';
  local_e8.V[0x36] = '\0';
  local_e8.V[0x37] = '\0';
  local_e8.V[0x38] = '\0';
  local_e8.V[0x39] = '\0';
  local_e8.V[0x3a] = '\0';
  local_e8.V[0x3b] = '\0';
  local_e8.V[0x3c] = '\0';
  local_e8.V[0x3d] = '\0';
  local_e8.V[0x3e] = '\0';
  local_e8.V[0x3f] = '\0';
  local_e8.reseed_counter = 0;
  local_e8._92_4_ = 0;
  local_e8.entropy_len = 0;
  local_e8.prediction_resistance = 0;
  local_e8.reseed_interval = 0;
  local_e8.f_entropy = (_func_int_void_ptr_uchar_ptr_size_t *)0x0;
  local_e8.p_entropy = (void *)0x0;
  if (verbose == 0) {
    test_offset = 0;
    iVar1 = mbedtls_hmac_drbg_seed
                      (&local_e8,md_info,hmac_drbg_self_test_entropy,entropy_pr,(uchar *)0x0,0);
    if (iVar1 != 0) {
      return 1;
    }
    local_e8.prediction_resistance = 1;
    iVar1 = mbedtls_hmac_drbg_random_with_add(&local_e8,local_68,0x50,(uchar *)0x0,0);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = mbedtls_hmac_drbg_random_with_add(&local_e8,local_68,0x50,(uchar *)0x0,0);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = bcmp(local_68,result_pr,0x50);
    if (iVar1 != 0) {
      return 1;
    }
LAB_00184b9b:
    mbedtls_md_free(&local_e8.md_ctx);
    lVar2 = 0;
    do {
      local_e8.V[lVar2 + -0x18] = '\0';
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x80);
    mbedtls_md_free(&local_e8.md_ctx);
    lVar2 = 0;
    do {
      local_e8.V[lVar2 + -0x18] = '\0';
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x80);
    if (verbose != 0) {
      puts("passed");
      printf("  HMAC_DRBG (PR = False) : ");
    }
    local_e8.f_entropy = (_func_int_void_ptr_uchar_ptr_size_t *)0x0;
    local_e8.p_entropy = (void *)0x0;
    local_e8.entropy_len = 0;
    local_e8.prediction_resistance = 0;
    local_e8.reseed_interval = 0;
    local_e8.V[0x38] = '\0';
    local_e8.V[0x39] = '\0';
    local_e8.V[0x3a] = '\0';
    local_e8.V[0x3b] = '\0';
    local_e8.V[0x3c] = '\0';
    local_e8.V[0x3d] = '\0';
    local_e8.V[0x3e] = '\0';
    local_e8.V[0x3f] = '\0';
    local_e8.reseed_counter = 0;
    local_e8._92_4_ = 0;
    local_e8.V[0x28] = '\0';
    local_e8.V[0x29] = '\0';
    local_e8.V[0x2a] = '\0';
    local_e8.V[0x2b] = '\0';
    local_e8.V[0x2c] = '\0';
    local_e8.V[0x2d] = '\0';
    local_e8.V[0x2e] = '\0';
    local_e8.V[0x2f] = '\0';
    local_e8.V[0x30] = '\0';
    local_e8.V[0x31] = '\0';
    local_e8.V[0x32] = '\0';
    local_e8.V[0x33] = '\0';
    local_e8.V[0x34] = '\0';
    local_e8.V[0x35] = '\0';
    local_e8.V[0x36] = '\0';
    local_e8.V[0x37] = '\0';
    local_e8.V[0x18] = '\0';
    local_e8.V[0x19] = '\0';
    local_e8.V[0x1a] = '\0';
    local_e8.V[0x1b] = '\0';
    local_e8.V[0x1c] = '\0';
    local_e8.V[0x1d] = '\0';
    local_e8.V[0x1e] = '\0';
    local_e8.V[0x1f] = '\0';
    local_e8.V[0x20] = '\0';
    local_e8.V[0x21] = '\0';
    local_e8.V[0x22] = '\0';
    local_e8.V[0x23] = '\0';
    local_e8.V[0x24] = '\0';
    local_e8.V[0x25] = '\0';
    local_e8.V[0x26] = '\0';
    local_e8.V[0x27] = '\0';
    local_e8.V[8] = '\0';
    local_e8.V[9] = '\0';
    local_e8.V[10] = '\0';
    local_e8.V[0xb] = '\0';
    local_e8.V[0xc] = '\0';
    local_e8.V[0xd] = '\0';
    local_e8.V[0xe] = '\0';
    local_e8.V[0xf] = '\0';
    local_e8.V[0x10] = '\0';
    local_e8.V[0x11] = '\0';
    local_e8.V[0x12] = '\0';
    local_e8.V[0x13] = '\0';
    local_e8.V[0x14] = '\0';
    local_e8.V[0x15] = '\0';
    local_e8.V[0x16] = '\0';
    local_e8.V[0x17] = '\0';
    local_e8.md_ctx.hmac_ctx = (void *)0x0;
    local_e8.V[0] = '\0';
    local_e8.V[1] = '\0';
    local_e8.V[2] = '\0';
    local_e8.V[3] = '\0';
    local_e8.V[4] = '\0';
    local_e8.V[5] = '\0';
    local_e8.V[6] = '\0';
    local_e8.V[7] = '\0';
    local_e8.md_ctx.md_info = (mbedtls_md_info_t *)0x0;
    local_e8.md_ctx.md_ctx = (void *)0x0;
    test_offset = 0;
    iVar1 = mbedtls_hmac_drbg_seed
                      (&local_e8,md_info,hmac_drbg_self_test_entropy,entropy_nopr,(uchar *)0x0,0);
    if (((iVar1 == 0) && (iVar1 = mbedtls_hmac_drbg_reseed(&local_e8,(uchar *)0x0,0), iVar1 == 0))
       && ((iVar1 = mbedtls_hmac_drbg_random_with_add(&local_e8,local_68,0x50,(uchar *)0x0,0),
           iVar1 == 0 &&
           ((iVar1 = mbedtls_hmac_drbg_random_with_add(&local_e8,local_68,0x50,(uchar *)0x0,0),
            iVar1 == 0 && (iVar1 = bcmp(local_68,result_nopr,0x50), iVar1 == 0)))))) {
      mbedtls_md_free(&local_e8.md_ctx);
      lVar2 = 0;
      do {
        local_e8.V[lVar2 + -0x18] = '\0';
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x80);
      mbedtls_md_free(&local_e8.md_ctx);
      lVar2 = 0;
      do {
        local_e8.V[lVar2 + -0x18] = '\0';
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x80);
      if (verbose == 0) {
        return 0;
      }
      puts("passed");
      putchar(10);
      return 0;
    }
    if (verbose != 0) {
      puts("failed");
    }
  }
  else {
    printf("  HMAC_DRBG (PR = True) : ");
    test_offset = 0;
    iVar1 = mbedtls_hmac_drbg_seed
                      (&local_e8,md_info,hmac_drbg_self_test_entropy,entropy_pr,(uchar *)0x0,0);
    if (iVar1 == 0) {
      local_e8.prediction_resistance = 1;
      iVar1 = mbedtls_hmac_drbg_random_with_add(&local_e8,local_68,0x50,(uchar *)0x0,0);
      if (((iVar1 == 0) &&
          (iVar1 = mbedtls_hmac_drbg_random_with_add(&local_e8,local_68,0x50,(uchar *)0x0,0),
          iVar1 == 0)) && (iVar1 = bcmp(local_68,result_pr,0x50), iVar1 == 0)) goto LAB_00184b9b;
    }
    puts("failed");
  }
  return 1;
}

Assistant:

int mbedtls_hmac_drbg_self_test( int verbose )
{
    mbedtls_hmac_drbg_context ctx;
    unsigned char buf[OUTPUT_LEN];
    const mbedtls_md_info_t *md_info = mbedtls_md_info_from_type( MBEDTLS_MD_SHA1 );

    mbedtls_hmac_drbg_init( &ctx );

    /*
     * PR = True
     */
    if( verbose != 0 )
        mbedtls_printf( "  HMAC_DRBG (PR = True) : " );

    test_offset = 0;
    CHK( mbedtls_hmac_drbg_seed( &ctx, md_info,
                         hmac_drbg_self_test_entropy, (void *) entropy_pr,
                         NULL, 0 ) );
    mbedtls_hmac_drbg_set_prediction_resistance( &ctx, MBEDTLS_HMAC_DRBG_PR_ON );
    CHK( mbedtls_hmac_drbg_random( &ctx, buf, OUTPUT_LEN ) );
    CHK( mbedtls_hmac_drbg_random( &ctx, buf, OUTPUT_LEN ) );
    CHK( memcmp( buf, result_pr, OUTPUT_LEN ) );
    mbedtls_hmac_drbg_free( &ctx );

    mbedtls_hmac_drbg_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    /*
     * PR = False
     */
    if( verbose != 0 )
        mbedtls_printf( "  HMAC_DRBG (PR = False) : " );

    mbedtls_hmac_drbg_init( &ctx );

    test_offset = 0;
    CHK( mbedtls_hmac_drbg_seed( &ctx, md_info,
                         hmac_drbg_self_test_entropy, (void *) entropy_nopr,
                         NULL, 0 ) );
    CHK( mbedtls_hmac_drbg_reseed( &ctx, NULL, 0 ) );
    CHK( mbedtls_hmac_drbg_random( &ctx, buf, OUTPUT_LEN ) );
    CHK( mbedtls_hmac_drbg_random( &ctx, buf, OUTPUT_LEN ) );
    CHK( memcmp( buf, result_nopr, OUTPUT_LEN ) );
    mbedtls_hmac_drbg_free( &ctx );

    mbedtls_hmac_drbg_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}